

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  sysbvm_heap_mallocObjectHeader_t *psVar4;
  ulong uVar5;
  
  psVar4 = heap->firstMallocObject;
  if (psVar4 != (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    uVar1 = heap->gcBlackColor;
    do {
      uVar2 = psVar4[1].field_0.field_0.size;
      if ((((uVar2 & 3) == uVar1) && ((uVar2 & 0x300) == 0x100 && ((int)psVar4 + 0x10U & 0xf) == 0))
         && (uVar2 = psVar4[1].field_0.words[3], 7 < uVar2)) {
        uVar5 = 0;
        do {
          uVar3 = *(ulong *)((long)&psVar4[2].field_0 + uVar5 * 8);
          if (((uVar3 & 0xf) == 0 && uVar3 != 0) && ((*(uint *)(uVar3 + 8) & 3) != uVar1)) {
            *(undefined8 *)((long)&psVar4[2].field_0 + uVar5 * 8) = 0x4f;
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 >> 3 != uVar5);
      }
      psVar4 = (psVar4->field_0).field_0.next;
    } while (psVar4 != (sysbvm_heap_mallocObjectHeader_s *)0x0);
  }
  return;
}

Assistant:

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)
{
    sysbvm_heap_mallocObjectHeader_t *objectHeader = heap->firstMallocObject;
    while(objectHeader)
    {
        sysbvm_object_tuple_t *object = (sysbvm_object_tuple_t*)(objectHeader + 1);
        if(sysbvm_tuple_getGCColor((sysbvm_tuple_t)object) == heap->gcBlackColor)
        {
            // Only check the slots of weak objects.
            if(sysbvm_tuple_isWeakObject((sysbvm_tuple_t)object))
            {
                size_t slotCount = object->header.objectSize / sizeof(sysbvm_tuple_t);
                sysbvm_tuple_t *slots = object->pointers;

                for(size_t i = 0; i < slotCount; ++i)
                {
                    if(sysbvm_tuple_isNonNullPointer(slots[i]) && sysbvm_tuple_getGCColor(slots[i]) != heap->gcBlackColor)
                        slots[i] = SYSBVM_TOMBSTONE_TUPLE;
                }
            }
        }

        objectHeader = objectHeader->next;
    }
}